

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O1

void __thiscall
capnp::compiler::Compiler::Impl::eagerlyCompile
          (Impl *this,uint64_t id,uint eagerness,SchemaLoader *finalLoader)

{
  size_t amount;
  Reader *pRVar1;
  RemoveConst<capnp::schema::Node::SourceInfo::Reader> *pRVar2;
  Reader *pRVar3;
  __buckets_ptr this_00;
  WirePointer *reader;
  size_t sVar4;
  Vector<capnp::schema::Node::SourceInfo::Reader> *__range4;
  _func_int **pp_Var5;
  Reader *sourceInfo;
  StructReader *this_01;
  MessageSizeCounts MVar6;
  ArrayPtr<capnp::word> uncheckedBuffer;
  Vector<capnp::schema::Node::SourceInfo::Reader> sourceInfos;
  uint64_t id_local;
  PointerReader local_f8;
  unordered_map<capnp::compiler::Compiler::Node_*,_unsigned_int,_std::hash<capnp::compiler::Compiler::Node_*>,_std::equal_to<capnp::compiler::Compiler::Node_*>,_std::allocator<std::pair<capnp::compiler::Compiler::Node_*const,_unsigned_int>_>_>
  seen;
  undefined1 local_98 [32];
  StructDataBitCount local_78;
  StructPointerCount SStack_74;
  undefined2 uStack_72;
  int iStack_70;
  undefined4 uStack_6c;
  _func_int **local_68;
  undefined4 local_60;
  undefined4 uStack_5c;
  undefined4 uStack_58;
  undefined4 uStack_54;
  undefined4 local_50;
  undefined4 uStack_4c;
  float fStack_48;
  undefined4 uStack_44;
  StructDataBitCount local_40;
  StructPointerCount SStack_3c;
  undefined2 uStack_3a;
  int iStack_38;
  undefined4 uStack_34;
  
  id_local = id;
  findNode((Impl *)&seen,(uint64_t)this);
  this_00 = seen._M_h._M_buckets;
  if (seen._M_h._M_buckets != (__buckets_ptr)0x0) {
    seen._M_h._M_buckets = &seen._M_h._M_single_bucket;
    seen._M_h._M_bucket_count = 1;
    seen._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    seen._M_h._M_element_count = 0;
    seen._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    seen._M_h._M_rehash_policy._M_next_resize = 0;
    seen._M_h._M_single_bucket = (__node_base_ptr)0x0;
    sourceInfos.builder.ptr = (Reader *)0x0;
    sourceInfos.builder.pos = (RemoveConst<capnp::schema::Node::SourceInfo::Reader> *)0x0;
    sourceInfos.builder.endPtr = (Reader *)0x0;
    sourceInfos.builder.disposer = (ArrayDisposer *)&kj::NullArrayDisposer::instance;
    Node::traverse((Node *)this_00,eagerness,&seen,finalLoader,&sourceInfos);
    pRVar2 = sourceInfos.builder.pos;
    if (sourceInfos.builder.ptr != sourceInfos.builder.pos) {
      this_01 = &(sourceInfos.builder.ptr)->_reader;
      do {
        MVar6 = capnp::_::StructReader::totalSize(this_01);
        amount = MVar6.wordCount * 8 + 8;
        sVar4 = 0;
        reader = (WirePointer *)kj::Arena::allocateBytes(&this->nodeArena,amount,8,false);
        memset(reader,0,amount);
        uncheckedBuffer.size_ = sVar4;
        uncheckedBuffer.ptr = (word *)(MVar6.wordCount + 1);
        copyToUnchecked<capnp::schema::Node::SourceInfo::Reader&>
                  ((capnp *)this_01,(Reader *)reader,uncheckedBuffer);
        if (this_01->dataSize < 0x40) {
          pp_Var5 = (_func_int **)0x0;
        }
        else {
          pp_Var5 = *this_01->data;
        }
        local_f8.segment = (SegmentReader *)0x0;
        local_f8.capTable = (CapTableReader *)0x0;
        local_f8.nestingLimit = 0x7fffffff;
        local_f8.pointer = reader;
        capnp::_::PointerReader::getStruct((StructReader *)local_98,&local_f8,(word *)0x0);
        local_40 = local_78;
        SStack_3c = SStack_74;
        uStack_3a = uStack_72;
        iStack_38 = iStack_70;
        uStack_34 = uStack_6c;
        local_50 = local_98._16_4_;
        uStack_4c = local_98._20_4_;
        fStack_48 = (float)local_98._24_4_;
        uStack_44 = local_98._28_4_;
        local_60 = local_98._0_4_;
        uStack_5c = local_98._4_4_;
        uStack_58 = local_98._8_4_;
        uStack_54 = local_98._12_4_;
        local_68 = pp_Var5;
        std::
        _Hashtable<unsigned_long,std::pair<unsigned_long_const,capnp::schema::Node::SourceInfo::Reader>,std::allocator<std::pair<unsigned_long_const,capnp::schema::Node::SourceInfo::Reader>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::_M_emplace<std::pair<unsigned_long,capnp::schema::Node::SourceInfo::Reader>>
                  ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,capnp::schema::Node::SourceInfo::Reader>,std::allocator<std::pair<unsigned_long_const,capnp::schema::Node::SourceInfo::Reader>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)&this->sourceInfoById,&local_68);
        this_01 = this_01 + 1;
      } while (this_01 != &pRVar2->_reader);
    }
    pRVar3 = sourceInfos.builder.endPtr;
    pRVar2 = sourceInfos.builder.pos;
    pRVar1 = sourceInfos.builder.ptr;
    if (sourceInfos.builder.ptr != (Reader *)0x0) {
      sourceInfos.builder.ptr = (Reader *)0x0;
      sourceInfos.builder.pos = (RemoveConst<capnp::schema::Node::SourceInfo::Reader> *)0x0;
      sourceInfos.builder.endPtr = (Reader *)0x0;
      (*(code *)**(undefined8 **)sourceInfos.builder.disposer)
                (sourceInfos.builder.disposer,pRVar1,0x30,
                 ((long)pRVar2 - (long)pRVar1 >> 4) * -0x5555555555555555,
                 ((long)pRVar3 - (long)pRVar1 >> 4) * -0x5555555555555555,0);
    }
    std::
    _Hashtable<capnp::compiler::Compiler::Node_*,_std::pair<capnp::compiler::Compiler::Node_*const,_unsigned_int>,_std::allocator<std::pair<capnp::compiler::Compiler::Node_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<capnp::compiler::Compiler::Node_*>,_std::hash<capnp::compiler::Compiler::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&seen._M_h);
    return;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[36],unsigned_long&>
            ((Fault *)&seen,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/compiler.c++"
             ,0x512,FAILED,(char *)0x0,"\"id did not come from this Compiler.\", id",
             (char (*) [36])"id did not come from this Compiler.",&id_local);
  kj::_::Debug::Fault::fatal((Fault *)&seen);
}

Assistant:

void Compiler::Impl::eagerlyCompile(uint64_t id, uint eagerness,
                                    const SchemaLoader& finalLoader) {
  KJ_IF_SOME(node, findNode(id)) {
    std::unordered_map<Node*, uint> seen;
    kj::Vector<schema::Node::SourceInfo::Reader> sourceInfos;
    node.traverse(eagerness, seen, finalLoader, sourceInfos);

    // Copy the SourceInfo structures into permanent space so that they aren't invalidated when
    // clearWorkspace() is called.
    for (auto& sourceInfo: sourceInfos) {
      auto words = nodeArena.allocateArray<word>(sourceInfo.totalSize().wordCount + 1);
      memset(words.begin(), 0, words.asBytes().size());
      copyToUnchecked(sourceInfo, words);
      sourceInfoById.insert(std::make_pair(sourceInfo.getId(),
          readMessageUnchecked<schema::Node::SourceInfo>(words.begin())));
    }
  } else {
    KJ_FAIL_REQUIRE("id did not come from this Compiler.", id);
  }
}